

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::CommandCompare::compareHeader(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  string_view jsonPathIn_02;
  string_view jsonPathIn_03;
  string_view jsonPathIn_04;
  string_view jsonPathIn_05;
  string_view jsonPathIn_06;
  string_view jsonPathIn_07;
  string_view jsonPathIn_08;
  string_view jsonPathIn_09;
  string_view jsonPathIn_10;
  string_view jsonPathIn_11;
  string_view jsonPathIn_12;
  string_view jsonPathIn_13;
  string_view textHeaderIn;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  string_view textHeaderIn_02;
  string_view textHeaderIn_03;
  string_view textHeaderIn_04;
  string_view textHeaderIn_05;
  string_view textHeaderIn_06;
  string_view textHeaderIn_07;
  string_view textHeaderIn_08;
  string_view textHeaderIn_09;
  string_view textHeaderIn_10;
  string_view textHeaderIn_11;
  string_view textHeaderIn_12;
  string_view textHeaderIn_13;
  string_view jsonPathIn_14;
  string_view textHeaderIn_14;
  string_view what;
  reference pvVar1;
  PrintDiff *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  string *in_stack_fffffffffffff7d8;
  PrintDiff *in_stack_fffffffffffff7e0;
  vector<KTX_header2,_std::allocator<KTX_header2>_> *in_stack_fffffffffffff7e8;
  ktxIndexEntry32 *__str;
  function<const_char_*(unsigned_long)> *in_stack_fffffffffffff7f0;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  uint *in_stack_fffffffffffff808;
  ktxIndexEntry32 *value1;
  DiffEnum<VkFormat> *in_stack_fffffffffffff810;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  char *in_stack_fffffffffffff818;
  ktx_uint32_t *pkVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  size_t in_stack_fffffffffffff828;
  ktxIndexEntry64 *pkVar4;
  char *in_stack_fffffffffffff830;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  unsigned_long *in_stack_fffffffffffff840;
  KTX_header2 *in_stack_fffffffffffff848;
  DiffIdentifier *in_stack_fffffffffffff850;
  size_t in_stack_fffffffffffff858;
  InputStreams *in_stack_fffffffffffff860;
  CommandCompare *in_stack_fffffffffffff868;
  char *in_stack_fffffffffffff870;
  char *in_stack_fffffffffffff878;
  KTX_header2 *in_stack_fffffffffffff880;
  DiffBase<unsigned_long> *in_stack_fffffffffffff8d8;
  PrintDiff *this_02;
  DiffBase<unsigned_long> local_178 [3];
  allocator<char> local_39;
  string local_38 [32];
  PrintDiff *local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818,
             (allocator<char> *)in_stack_fffffffffffff810);
  PrintDiff::setContext(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  what._M_str = in_stack_fffffffffffff878;
  what._M_len = (size_t)in_stack_fffffffffffff870;
  read<KTX_header2>(in_stack_fffffffffffff868,in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                    what);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator=
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)in_stack_fffffffffffff7f0,
             in_stack_fffffffffffff7e8);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::~vector
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)in_stack_fffffffffffff7f0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
  textHeaderIn_14._M_str = in_stack_fffffffffffff870;
  textHeaderIn_14._M_len = (size_t)in_stack_fffffffffffff868;
  jsonPathIn_14._M_str = (char *)in_stack_fffffffffffff860;
  jsonPathIn_14._M_len = in_stack_fffffffffffff858;
  DiffIdentifier::DiffIdentifier
            (in_stack_fffffffffffff850,textHeaderIn_14,jsonPathIn_14,in_stack_fffffffffffff848,
             in_stack_fffffffffffff880);
  PrintDiff::operator<<
            (local_18,(DiffBase<std::array<unsigned_char,_12UL>_> *)in_stack_fffffffffffff8d8);
  this_02 = local_18;
  if ((*(byte *)(in_RDI + 0xa1) & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
               (char *)in_stack_fffffffffffff7e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
               (char *)in_stack_fffffffffffff7e8);
    pvVar1 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                       ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    local_178[0].jsonPath._M_str._4_4_ = pvVar1->vkFormat;
    pvVar1 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                       ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    local_178[0].jsonPath._M_str._0_4_ = pvVar1->vkFormat;
    in_stack_fffffffffffff8d8 = local_178;
    std::function<char_const*(unsigned_long)>::
    function<ktx::CommandCompare::compareHeader(ktx::PrintDiff&,std::array<ktx::InputStream,2ul>&)::__0,void>
              (in_stack_fffffffffffff7f0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff7e8);
    textHeaderIn._M_str = in_stack_fffffffffffff830;
    textHeaderIn._M_len = in_stack_fffffffffffff828;
    jsonPathIn._M_str = (char *)in_stack_fffffffffffff820;
    jsonPathIn._M_len = (size_t)in_stack_fffffffffffff818;
    DiffEnum<VkFormat>::DiffEnum
              (in_stack_fffffffffffff810,textHeaderIn,jsonPathIn,
               (int32_t *)in_stack_fffffffffffff808,(int32_t *)in_stack_fffffffffffff840,
               (function<const_char_*(unsigned_long)> *)in_stack_fffffffffffff848);
    PrintDiff::operator<<(local_18,(DiffBase<VkFormat> *)in_stack_fffffffffffff8d8);
    std::function<const_char_*(unsigned_long)>::~function
              ((function<const_char_*(unsigned_long)> *)0x158468);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
               (char *)in_stack_fffffffffffff7e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
               (char *)in_stack_fffffffffffff7e8);
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    textHeaderIn_00._M_str = in_stack_fffffffffffff830;
    textHeaderIn_00._M_len = in_stack_fffffffffffff828;
    jsonPathIn_00._M_str = (char *)in_stack_fffffffffffff820;
    jsonPathIn_00._M_len = (size_t)in_stack_fffffffffffff818;
    Diff<unsigned_int>::Diff
              ((Diff<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_00,jsonPathIn_00,
               in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
    PrintDiff::operator<<(local_18,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
    this_02 = local_18;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
  textHeaderIn_01._M_str = in_stack_fffffffffffff830;
  textHeaderIn_01._M_len = in_stack_fffffffffffff828;
  jsonPathIn_01._M_str = (char *)in_stack_fffffffffffff820;
  jsonPathIn_01._M_len = (size_t)in_stack_fffffffffffff818;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_01,jsonPathIn_01,
             in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
  PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
  textHeaderIn_02._M_str = in_stack_fffffffffffff830;
  textHeaderIn_02._M_len = in_stack_fffffffffffff828;
  jsonPathIn_02._M_str = (char *)in_stack_fffffffffffff820;
  jsonPathIn_02._M_len = (size_t)in_stack_fffffffffffff818;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_02,jsonPathIn_02,
             in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
  PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
  textHeaderIn_03._M_str = in_stack_fffffffffffff830;
  textHeaderIn_03._M_len = in_stack_fffffffffffff828;
  jsonPathIn_03._M_str = (char *)in_stack_fffffffffffff820;
  jsonPathIn_03._M_len = (size_t)in_stack_fffffffffffff818;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_03,jsonPathIn_03,
             in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
  PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
  textHeaderIn_04._M_str = in_stack_fffffffffffff830;
  textHeaderIn_04._M_len = in_stack_fffffffffffff828;
  jsonPathIn_04._M_str = (char *)in_stack_fffffffffffff820;
  jsonPathIn_04._M_len = (size_t)in_stack_fffffffffffff818;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_04,jsonPathIn_04,
             in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
  PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
  textHeaderIn_05._M_str = in_stack_fffffffffffff830;
  textHeaderIn_05._M_len = in_stack_fffffffffffff828;
  jsonPathIn_05._M_str = (char *)in_stack_fffffffffffff820;
  jsonPathIn_05._M_len = (size_t)in_stack_fffffffffffff818;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_05,jsonPathIn_05,
             in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
  PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
             (char *)in_stack_fffffffffffff7e8);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
            ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
  textHeaderIn_06._M_str = in_stack_fffffffffffff830;
  textHeaderIn_06._M_len = in_stack_fffffffffffff828;
  jsonPathIn_06._M_str = (char *)in_stack_fffffffffffff820;
  jsonPathIn_06._M_len = (size_t)in_stack_fffffffffffff818;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_06,jsonPathIn_06,
             in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
  PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
  if ((*(byte *)(in_RDI + 0xa2) & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
               (char *)in_stack_fffffffffffff7e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7f0,
               (char *)in_stack_fffffffffffff7e8);
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    textHeaderIn_07._M_str = in_stack_fffffffffffff830;
    textHeaderIn_07._M_len = in_stack_fffffffffffff828;
    jsonPathIn_07._M_str = (char *)in_stack_fffffffffffff820;
    jsonPathIn_07._M_len = (size_t)in_stack_fffffffffffff818;
    DiffEnum<ktxSupercmpScheme>::DiffEnum
              ((DiffEnum<ktxSupercmpScheme> *)in_stack_fffffffffffff810,textHeaderIn_07,
               jsonPathIn_07,in_stack_fffffffffffff808,(uint32_t *)in_stack_fffffffffffff840);
    PrintDiff::operator<<(this_02,(DiffBase<ktxSupercmpScheme> *)in_stack_fffffffffffff8d8);
  }
  if (*(int *)(in_RDI + 0xa4) != 0) {
    this_00 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_10,(char *)in_stack_fffffffffffff7e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_stack_fffffffffffff7e8);
    pvVar1 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                       ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    __str = &pvVar1->dataFormatDescriptor;
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    textHeaderIn_08._M_str = in_stack_fffffffffffff830;
    textHeaderIn_08._M_len = in_stack_fffffffffffff828;
    jsonPathIn_08._M_str = (char *)in_stack_fffffffffffff820;
    jsonPathIn_08._M_len = (size_t)in_stack_fffffffffffff818;
    DiffHex<unsigned_int>::DiffHex
              ((DiffHex<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_08,jsonPathIn_08,
               in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
    PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    textHeaderIn_09._M_str = in_stack_fffffffffffff830;
    textHeaderIn_09._M_len = in_stack_fffffffffffff828;
    jsonPathIn_09._M_str = (char *)in_stack_fffffffffffff820;
    jsonPathIn_09._M_len = (size_t)in_stack_fffffffffffff818;
    Diff<unsigned_int>::Diff
              ((Diff<unsigned_int> *)in_stack_fffffffffffff810,textHeaderIn_09,jsonPathIn_09,
               in_stack_fffffffffffff808,(uint *)in_stack_fffffffffffff840);
    PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
    this_01 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    pvVar1 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                       ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    value1 = &pvVar1->keyValueData;
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    textHeaderIn_10._M_str = in_stack_fffffffffffff830;
    textHeaderIn_10._M_len = in_stack_fffffffffffff828;
    jsonPathIn_10._M_str = (char *)in_stack_fffffffffffff820;
    jsonPathIn_10._M_len = (size_t)in_stack_fffffffffffff818;
    DiffHex<unsigned_int>::DiffHex
              ((DiffHex<unsigned_int> *)this_01,textHeaderIn_10,jsonPathIn_10,&value1->byteOffset,
               (uint *)in_stack_fffffffffffff840);
    PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
    pbVar3 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    pvVar1 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                       ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    pkVar2 = &(pvVar1->keyValueData).byteLength;
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    textHeaderIn_11._M_str = in_stack_fffffffffffff830;
    textHeaderIn_11._M_len = in_stack_fffffffffffff828;
    jsonPathIn_11._M_str = (char *)pbVar3;
    jsonPathIn_11._M_len = (size_t)pkVar2;
    Diff<unsigned_int>::Diff
              ((Diff<unsigned_int> *)this_01,textHeaderIn_11,jsonPathIn_11,&value1->byteOffset,
               (uint *)in_stack_fffffffffffff840);
    PrintDiff::operator<<(this_02,(DiffBase<unsigned_int> *)in_stack_fffffffffffff8d8);
    pbVar5 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    pvVar1 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                       ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    pkVar4 = &pvVar1->supercompressionGlobalData;
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    textHeaderIn_12._M_str = (char *)pbVar5;
    textHeaderIn_12._M_len = (size_t)pkVar4;
    jsonPathIn_12._M_str = (char *)pbVar3;
    jsonPathIn_12._M_len = (size_t)pkVar2;
    DiffHex<unsigned_long>::DiffHex
              ((DiffHex<unsigned_long> *)this_01,textHeaderIn_12,jsonPathIn_12,
               (unsigned_long *)value1,in_stack_fffffffffffff840);
    PrintDiff::operator<<(this_02,in_stack_fffffffffffff8d8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),0);
    std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
              ((vector<KTX_header2,_std::allocator<KTX_header2>_> *)(in_RDI + 0xf0),1);
    textHeaderIn_13._M_str = (char *)pbVar5;
    textHeaderIn_13._M_len = (size_t)pkVar4;
    jsonPathIn_13._M_str = (char *)pbVar3;
    jsonPathIn_13._M_len = (size_t)pkVar2;
    Diff<unsigned_long>::Diff
              ((Diff<unsigned_long> *)this_01,textHeaderIn_13,jsonPathIn_13,(unsigned_long *)value1,
               &local_10->_M_len);
    PrintDiff::operator<<(this_02,in_stack_fffffffffffff8d8);
  }
  return;
}

Assistant:

void CommandCompare::compareHeader(PrintDiff& diff, InputStreams& streams) {
    diff.setContext("Header\n\n");

    headers = read<KTX_header2>(streams, 0, "header");

    diff << DiffIdentifier("identifier", "/header/identifier", headers[0], headers[1]);

    if (!options.ignoreFormatHeader) {
        diff << DiffEnum<VkFormat>("vkFormat", "/header/vkFormat", headers[0].vkFormat, headers[1].vkFormat,
            [&](auto i) { return vkFormatString(VkFormat(headers[i].vkFormat)); });
        diff << Diff("typeSize", "/header/typeSize", headers[0].typeSize, headers[1].typeSize);
    }

    diff << Diff("pixelWidth", "/header/pixelWidth", headers[0].pixelWidth, headers[1].pixelWidth);
    diff << Diff("pixelHeight", "/header/pixelHeight", headers[0].pixelHeight, headers[1].pixelHeight);
    diff << Diff("pixelDepth", "/header/pixelDepth", headers[0].pixelDepth, headers[1].pixelDepth);
    diff << Diff("layerCount", "/header/layerCount", headers[0].layerCount, headers[1].layerCount);
    diff << Diff("faceCount", "/header/faceCount", headers[0].faceCount, headers[1].faceCount);
    diff << Diff("levelCount", "/header/levelCount", headers[0].levelCount, headers[1].levelCount);

    if (!options.ignoreSupercomp)
        diff << DiffEnum<ktxSupercmpScheme>("supercompressionScheme", "/header/supercompressionScheme",
            headers[0].supercompressionScheme, headers[1].supercompressionScheme);

    if (options.ignoreIndex != IgnoreIndex::all) {
        diff << DiffHex("dataFormatDescriptor.byteOffset", "/index/dataFormatDescriptor/byteOffset",
            headers[0].dataFormatDescriptor.byteOffset, headers[1].dataFormatDescriptor.byteOffset);
        diff << Diff("dataFormatDescriptor.byteLength", "/index/dataFormatDescriptor/byteLength",
            headers[0].dataFormatDescriptor.byteLength, headers[1].dataFormatDescriptor.byteLength);

        diff << DiffHex("keyValueData.byteOffset", "/index/keyValueData/byteOffset",
            headers[0].keyValueData.byteOffset, headers[1].keyValueData.byteOffset);
        diff << Diff("keyValueData.byteLength", "/index/keyValueData/byteLength",
            headers[0].keyValueData.byteLength, headers[1].keyValueData.byteLength);

        diff << DiffHex("supercompressionGlobalData.byteOffset", "/index/supercompressionGlobalData/byteOffset",
            headers[0].supercompressionGlobalData.byteOffset, headers[1].supercompressionGlobalData.byteOffset);
        diff << Diff("supercompressionGlobalData.byteLength", "/index/supercompressionGlobalData/byteLength",
            headers[0].supercompressionGlobalData.byteLength, headers[1].supercompressionGlobalData.byteLength);
    }
}